

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O1

void __thiscall solitaire::graphics::SDLGraphicsSystem::quit(SDLGraphicsSystem *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer this_00;
  
  puVar1 = (this->textures).
           super__Vector_base<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->textures).
           super__Vector_base<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = puVar1;
  if (puVar2 != puVar1) {
    do {
      std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>::~unique_ptr(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != puVar2);
    (this->textures).
    super__Vector_base<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  std::__uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>::reset
            ((__uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> *)&this->renderer
             ,(pointer)0x0);
  std::__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>::reset
            ((__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)&this->window,
             (pointer)0x0);
  if (this->isSDLInitialized != true) {
    return;
  }
  this->isSDLInitialized = false;
  (*((this->sdl)._M_t.
     super___uniq_ptr_impl<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
     ._M_t.
     super__Tuple_impl<0UL,_solitaire::SDL::interfaces::Wrapper_*,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
     .super__Head_base<0UL,_solitaire::SDL::interfaces::Wrapper_*,_false>._M_head_impl)->
    _vptr_Wrapper[3])();
  return;
}

Assistant:

void SDLGraphicsSystem::quit() {
    textures.clear();
    renderer.reset();
    window.reset();

    if (isSDLInitialized)
    {
        isSDLInitialized = false;
        sdl->quit();
    }
}